

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O3

void line_draw_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Style ls;
  Am_Style local_38;
  
  pAVar5 = Am_Object::Get(self,0x8b,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x8c,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x8d,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x8e,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x6b,0);
  Am_Style::Am_Style(&local_38,pAVar5);
  (*drawonable->_vptr_Am_Drawonable[0x28])
            (drawonable,&local_38,(ulong)(uint)(iVar1 + x_offset),(ulong)(uint)(iVar2 + y_offset),
             (ulong)(uint)(x_offset + iVar3),(ulong)(uint)(y_offset + iVar4),0);
  Am_Style::~Am_Style(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, line_draw,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int x1 = (int)self.Get(Am_X1) + x_offset;
  int y1 = (int)self.Get(Am_Y1) + y_offset;
  int x2 = (int)self.Get(Am_X2) + x_offset;
  int y2 = (int)self.Get(Am_Y2) + y_offset;
  Am_Style ls = self.Get(Am_LINE_STYLE);
  drawonable->Draw_Line(ls, x1, y1, x2, y2);
}